

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

uint8 * __thiscall
sentencepiece::SentencePieceText::_InternalSerialize
          (SentencePieceText *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  float fVar2;
  SentencePieceText_SentencePiece *this_00;
  void *pvVar3;
  bool bVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  size_t __n;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->text_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  iVar10 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar10 != 0) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (SentencePieceText_SentencePiece *)
                ((this->pieces_).super_RepeatedPtrFieldBase.rep_)->elements[iVar11];
      *target = '\x12';
      uVar8 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar5 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar5 = target + 3;
        }
        else {
          puVar5 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar6 = puVar5;
            puVar6[-1] = (byte)uVar8 | 0x80;
            uVar9 = uVar8 >> 7;
            puVar5 = puVar6 + 1;
            bVar4 = 0x3fff < uVar8;
            uVar8 = uVar9;
          } while (bVar4);
          *puVar6 = (uint8)uVar9;
        }
      }
      target = SentencePieceText_SentencePiece::_InternalSerialize(this_00,puVar5,stream);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar10);
  }
  if ((uVar1 & 2) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    fVar2 = this->score_;
    *target = '\x1d';
    *(float *)(target + 1) = fVar2;
    target = target + 5;
  }
  puVar5 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    uVar7 = (ulong)pvVar3 & 0xfffffffffffffffe;
    pvVar3 = *(void **)(uVar7 + 8);
    iVar10 = (int)*(undefined8 *)(uVar7 + 0x10);
    __n = (size_t)iVar10;
    if ((long)stream->end_ - (long)puVar5 < (long)__n) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar3,iVar10,puVar5);
      return puVar5;
    }
    memcpy(puVar5,pvVar3,__n);
    puVar5 = puVar5 + __n;
  }
  return puVar5;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SentencePieceText::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string text = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_text(), target);
  }

  // repeated .sentencepiece.SentencePieceText.SentencePiece pieces = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_pieces_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(2, this->_internal_pieces(i), target, stream);
  }

  // optional float score = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(3, this->_internal_score(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.SentencePieceText)
  return target;
}